

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_sd_right_to_left<double,double>(double *x,size_t n,double *sd_arr)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double local_40;
  size_t row;
  double mean_prev;
  double running_ssq;
  double running_mean;
  double *sd_arr_local;
  size_t n_local;
  double *x_local;
  undefined4 uVar6;
  
  running_mean = 0.0;
  running_ssq = 0.0;
  mean_prev = x[n - 1];
  for (row = 0; row < n - 1; row = row + 1) {
    lVar1 = row + 1;
    auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar2._0_8_ = lVar1;
    auVar2._12_4_ = 0x45300000;
    running_mean = (x[~row + n] - running_mean) /
                   ((auVar2._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) + running_mean;
    running_ssq = (x[(n - row) + -1] - running_mean) * (x[(n - row) + -1] - mean_prev) + running_ssq
    ;
    if (row == 0) {
      local_40 = 0.0;
    }
    else {
      lVar1 = row + 1;
      auVar3._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar3._0_8_ = lVar1;
      auVar3._12_4_ = 0x45300000;
      local_40 = SQRT(running_ssq /
                      ((auVar3._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)));
    }
    sd_arr[(n - row) + -1] = local_40;
    mean_prev = running_mean;
  }
  uVar6 = (undefined4)(n >> 0x20);
  auVar5._8_4_ = uVar6;
  auVar5._0_8_ = n;
  auVar5._12_4_ = 0x45300000;
  auVar4._8_4_ = uVar6;
  auVar4._0_8_ = n;
  auVar4._12_4_ = 0x45300000;
  return SQRT(((*x - (running_mean +
                     (*x - running_mean) /
                     ((auVar5._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)))) *
               (*x - mean_prev) + running_ssq) /
              ((auVar4._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)));
}

Assistant:

real_t calc_sd_right_to_left(real_t_ *restrict x, size_t n, double *restrict sd_arr)
{
    real_t running_mean = 0;
    real_t running_ssq = 0;
    real_t mean_prev = x[n-1];
    for (size_t row = 0; row < n-1; row++)
    {
        running_mean   += (x[n-row-1] - running_mean) / (real_t)(row+1);
        running_ssq    += (x[n-row-1] - running_mean) * (x[n-row-1] - mean_prev);
        mean_prev       =  running_mean;
        sd_arr[n-row-1] = (row == 0)? 0. : std::sqrt(running_ssq / (real_t)(row+1));
    }
    running_mean   += (x[0] - running_mean) / (real_t)n;
    running_ssq    += (x[0] - running_mean) * (x[0] - mean_prev);
    return std::sqrt(running_ssq / (real_t)n);
}